

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NamedStructurePatternMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NamedStructurePatternMemberSyntax,slang::syntax::NamedStructurePatternMemberSyntax_const&>
          (BumpAllocator *this,NamedStructurePatternMemberSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  Info *pIVar3;
  PatternSyntax *pPVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  SyntaxKind SVar13;
  undefined4 uVar14;
  NamedStructurePatternMemberSyntax *pNVar15;
  
  pNVar15 = (NamedStructurePatternMemberSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NamedStructurePatternMemberSyntax *)this->endPtr < pNVar15 + 1) {
    pNVar15 = (NamedStructurePatternMemberSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pNVar15 + 1);
  }
  SVar13 = (args->super_StructurePatternMemberSyntax).super_SyntaxNode.kind;
  uVar14 = *(undefined4 *)&(args->super_StructurePatternMemberSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_StructurePatternMemberSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_StructurePatternMemberSyntax).super_SyntaxNode.previewNode;
  TVar9 = (args->name).kind;
  uVar10 = (args->name).field_0x2;
  NVar11.raw = (args->name).numFlags.raw;
  uVar12 = (args->name).rawLen;
  pIVar3 = (args->name).info;
  TVar5 = (args->colon).kind;
  uVar6 = (args->colon).field_0x2;
  NVar7.raw = (args->colon).numFlags.raw;
  uVar8 = (args->colon).rawLen;
  pPVar4 = (args->pattern).ptr;
  (pNVar15->colon).info = (args->colon).info;
  (pNVar15->pattern).ptr = pPVar4;
  (pNVar15->name).info = pIVar3;
  (pNVar15->colon).kind = TVar5;
  (pNVar15->colon).field_0x2 = uVar6;
  (pNVar15->colon).numFlags = (NumericTokenFlags)NVar7.raw;
  (pNVar15->colon).rawLen = uVar8;
  (pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pNVar15->name).kind = TVar9;
  (pNVar15->name).field_0x2 = uVar10;
  (pNVar15->name).numFlags = (NumericTokenFlags)NVar11.raw;
  (pNVar15->name).rawLen = uVar12;
  (pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.kind = SVar13;
  *(undefined4 *)&(pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.field_0x4 = uVar14;
  (pNVar15->super_StructurePatternMemberSyntax).super_SyntaxNode.parent = pSVar1;
  return pNVar15;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }